

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

bool __thiscall zmq::stream_t::xhas_in(stream_t *this)

{
  msg_t *msg_;
  msg_t *this_00;
  byte bVar1;
  int iVar2;
  blob_t *pbVar3;
  metadata_t *metadata_;
  void *__dest;
  bool bVar4;
  pipe_t *pipe;
  pipe_t *local_30;
  
  bVar4 = true;
  if (this->_prefetched == false) {
    local_30 = (pipe_t *)0x0;
    msg_ = &this->_prefetched_msg;
    iVar2 = fq_t::recvpipe(&this->_fq,msg_,&local_30);
    bVar4 = iVar2 == 0;
    if (bVar4) {
      if (local_30 == (pipe_t *)0x0) {
        xhas_in();
      }
      bVar1 = msg_t::flags(msg_);
      if ((bVar1 & 1) != 0) {
        xhas_in();
      }
      pbVar3 = pipe_t::get_routing_id(local_30);
      this_00 = &this->_prefetched_routing_id;
      iVar2 = msg_t::init_size(this_00,pbVar3->_size);
      if (iVar2 != 0) {
        xhas_in();
      }
      metadata_ = msg_t::metadata(msg_);
      if (metadata_ != (metadata_t *)0x0) {
        msg_t::set_metadata(this_00,metadata_);
      }
      __dest = msg_t::data(this_00);
      memcpy(__dest,pbVar3->_data,pbVar3->_size);
      msg_t::set_flags(this_00,'\x01');
      this->_prefetched = true;
      this->_routing_id_sent = false;
    }
  }
  return bVar4;
}

Assistant:

bool zmq::stream_t::xhas_in ()
{
    //  We may already have a message pre-fetched.
    if (_prefetched)
        return true;

    //  Try to read the next message.
    //  The message, if read, is kept in the pre-fetch buffer.
    pipe_t *pipe = NULL;
    int rc = _fq.recvpipe (&_prefetched_msg, &pipe);
    if (rc != 0)
        return false;

    zmq_assert (pipe != NULL);
    zmq_assert ((_prefetched_msg.flags () & msg_t::more) == 0);

    const blob_t &routing_id = pipe->get_routing_id ();
    rc = _prefetched_routing_id.init_size (routing_id.size ());
    errno_assert (rc == 0);

    // forward metadata (if any)
    metadata_t *metadata = _prefetched_msg.metadata ();
    if (metadata)
        _prefetched_routing_id.set_metadata (metadata);

    memcpy (_prefetched_routing_id.data (), routing_id.data (),
            routing_id.size ());
    _prefetched_routing_id.set_flags (msg_t::more);

    _prefetched = true;
    _routing_id_sent = false;

    return true;
}